

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

void ggml_backend_tensor_set(ggml_tensor *tensor,void *data,size_t offset,size_t size)

{
  ggml_backend_buffer_t pgVar1;
  ggml_tensor *pgVar2;
  size_t sVar3;
  char *pcVar4;
  int line;
  
  if (tensor == (ggml_tensor *)0x0) {
    pcVar4 = "tensor";
    line = 0x101;
  }
  else {
    pgVar2 = tensor->view_src;
    if (tensor->view_src == (ggml_tensor *)0x0) {
      pgVar2 = tensor;
    }
    if (size == 0) {
      return;
    }
    pgVar1 = pgVar2->buffer;
    if (pgVar1 == (ggml_backend_buffer_t)0x0) {
      pcVar4 = "buf != NULL && \"tensor buffer not set\"";
      line = 0x108;
    }
    else if (tensor->data == (void *)0x0) {
      pcVar4 = "tensor->data != NULL && \"tensor not allocated\"";
      line = 0x109;
    }
    else {
      sVar3 = ggml_nbytes(tensor);
      if (size + offset <= sVar3) {
        (*(pgVar1->iface).set_tensor)(pgVar1,tensor,data,offset,size);
        return;
      }
      pcVar4 = "offset + size <= ggml_nbytes(tensor) && \"tensor write out of bounds\"";
      line = 0x10a;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

void ggml_backend_tensor_set(struct ggml_tensor * tensor, const void * data, size_t offset, size_t size) {
    GGML_ASSERT(tensor);
    ggml_backend_buffer_t buf = tensor->view_src ? tensor->view_src->buffer : tensor->buffer;

    if (size == 0) {
        return;
    }

    GGML_ASSERT(buf != NULL && "tensor buffer not set");
    GGML_ASSERT(tensor->data != NULL && "tensor not allocated");
    GGML_ASSERT(offset + size <= ggml_nbytes(tensor) && "tensor write out of bounds");

    buf->iface.set_tensor(buf, tensor, data, offset, size);
}